

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getPicturesFolder.cpp
# Opt level: O2

int main(void)

{
  PlatformFolders p;
  PlatformFolders local_30;
  string local_28;
  
  sago::getPicturesFolder_abi_cxx11_();
  run_test(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  sago::PlatformFolders::PlatformFolders(&local_30);
  sago::PlatformFolders::getPicturesFolder_abi_cxx11_(&local_28,&local_30);
  run_test(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  sago::PlatformFolders::~PlatformFolders(&local_30);
  return 0;
}

Assistant:

int main() {
	run_test(sago::getPicturesFolder());
	sago::PlatformFolders p;
	run_test(p.getPicturesFolder());
	return 0;
}